

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absval.cpp
# Opt level: O2

int __thiscall ncnn::AbsVal::forward_inplace(AbsVal *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  void *pvVar7;
  ulong uVar8;
  int i;
  ulong uVar9;
  
  uVar4 = bottom_top_blob->h * bottom_top_blob->w;
  pvVar7 = bottom_top_blob->data;
  sVar2 = bottom_top_blob->cstep;
  sVar3 = bottom_top_blob->elemsize;
  uVar8 = 0;
  uVar5 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar5 = uVar8;
  }
  uVar6 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar6 = uVar8;
  }
  for (; uVar8 != uVar6; uVar8 = uVar8 + 1) {
    for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
      fVar1 = *(float *)((long)pvVar7 + uVar9 * 4);
      if (fVar1 < 0.0) {
        *(float *)((long)pvVar7 + uVar9 * 4) = -fVar1;
      }
    }
    pvVar7 = (void *)((long)pvVar7 + sVar2 * sVar3);
  }
  return 0;
}

Assistant:

int AbsVal::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            if (ptr[i] < 0)
                ptr[i] = -ptr[i];
        }
    }

    return 0;
}